

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::MergeFromImpl<false>
          (internal *this,BoundedZCIS input,MessageLite *msg,ParseFlags parse_flags)

{
  bool bVar1;
  ParseFlags parse_flags_00;
  ParseContext *ctx_00;
  char *ptr;
  ParseContext ctx;
  char *local_b8;
  internal *local_b0;
  int local_a8 [2];
  ParseContext local_a0;
  
  ctx_00 = input._8_8_;
  local_a8[0] = (int)input.zcis;
  bVar1 = false;
  local_b0 = this;
  ParseContext::ParseContext<google::protobuf::io::ZeroCopyInputStream*&,int&>
            (&local_a0,io::CodedInputStream::default_recursion_limit_,false,&local_b8,
             (ZeroCopyInputStream **)&local_b0,local_a8);
  local_b8 = (char *)(**(code **)((ctx_00->super_EpsCopyInputStream).limit_end_ + 0x50))
                               (ctx_00,local_b8,&local_a0);
  if (local_b8 != (char *)0x0) {
    EpsCopyInputStream::BackUp(&local_a0.super_EpsCopyInputStream,local_b8);
    if (local_a0.super_EpsCopyInputStream.last_tag_minus_1_ == 0) {
      bVar1 = anon_unknown_13::CheckFieldPresence
                        (ctx_00,(MessageLite *)((ulong)msg & 0xffffffff),parse_flags_00);
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool MergeFromImpl(BoundedZCIS input, MessageLite* msg,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input.zcis, input.limit);
  ptr = msg->_InternalParse(ptr, &ctx);
  if (PROTOBUF_PREDICT_FALSE(!ptr)) return false;
  ctx.BackUp(ptr);
  if (PROTOBUF_PREDICT_TRUE(ctx.EndedAtLimit())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}